

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  ulong *puVar2;
  tbinptr pmVar3;
  tbinptr pmVar4;
  malloc_tree_chunk *pmVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  tbinptr pmVar10;
  malloc_tree_chunk *pmVar11;
  uint uVar12;
  malloc_tree_chunk *pmVar13;
  long lVar14;
  ulong uVar15;
  
  pmVar1 = (tbinptr)((long)&p->prev_foot + psize);
  if ((p->head & 1) == 0) {
    uVar15 = p->prev_foot;
    if ((p->head & 2) == 0) {
      psize = psize + 0x20 + uVar15;
      iVar8 = munmap((void *)((long)p - uVar15),psize);
      if (iVar8 == 0) {
        m->footprint = m->footprint - psize;
      }
LAB_00139bb5:
      bVar7 = false;
    }
    else {
      p = (mchunkptr)((long)p - uVar15);
      pmVar3 = (tbinptr)m->least_addr;
      if (p < pmVar3) goto LAB_0013a0e5;
      psize = psize + uVar15;
      if ((tbinptr)p == (tbinptr)m->dv) {
        uVar15 = pmVar1->head;
        bVar7 = true;
        if ((~(uint)uVar15 & 3) == 0) {
          m->dvsize = psize;
          pmVar1->head = uVar15 & 0xfffffffffffffffe;
          ((tbinptr)p)->head = psize | 1;
          pmVar1->prev_foot = psize;
          goto LAB_00139bb5;
        }
      }
      else {
        if (0xff < uVar15) {
          pmVar11 = ((tbinptr)p)->bk;
          pmVar13 = ((tbinptr)p)->child[2];
          if (pmVar11 == (malloc_tree_chunk *)p) {
            pmVar11 = ((tbinptr)p)->child[1];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              pmVar10 = (tbinptr)(((tbinptr)p)->child + 1);
LAB_00139c32:
              do {
                if (pmVar11->child[1] == (malloc_tree_chunk *)0x0) {
                  if (pmVar11->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00139c46;
                  pmVar10 = (tbinptr)pmVar11->child;
                }
                else {
                  pmVar10 = (tbinptr)(pmVar11->child + 1);
                }
                pmVar11 = (malloc_tree_chunk *)pmVar10->prev_foot;
              } while( true );
            }
            pmVar11 = ((tbinptr)p)->child[0];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              pmVar10 = (tbinptr)((tbinptr)p)->child;
              goto LAB_00139c32;
            }
            pmVar11 = (malloc_tree_chunk *)0x0;
          }
          else {
            pmVar10 = ((tbinptr)p)->fd;
            if (((pmVar10 < pmVar3) || (pmVar10->bk != (malloc_tree_chunk *)p)) ||
               (pmVar11->fd != (malloc_tree_chunk *)p)) goto LAB_0013a0e5;
            pmVar10->bk = pmVar11;
            pmVar11->fd = pmVar10;
          }
          goto LAB_00139c56;
        }
        pmVar10 = ((tbinptr)p)->fd;
        pmVar4 = ((tbinptr)p)->bk;
        if ((pmVar10 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
           ((pmVar10 < pmVar3 || (pmVar10->bk != (malloc_tree_chunk *)p)))) goto LAB_0013a0e5;
        if (pmVar4 == pmVar10) {
          bVar6 = (byte)(uVar15 >> 3) & 0x1f;
          m->smallmap = m->smallmap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        }
        else {
          if ((pmVar4 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
             ((pmVar4 < pmVar3 || (pmVar4->fd != (malloc_tree_chunk *)p)))) goto LAB_0013a0e5;
          pmVar10->bk = pmVar4;
          pmVar4->fd = pmVar10;
        }
        bVar7 = true;
      }
    }
    goto LAB_00139cee;
  }
  goto LAB_00139cf7;
code_r0x0013a00a:
  if (pmVar10 < pmVar3) goto LAB_0013a0e5;
  pmVar10->prev_foot = 0;
  goto LAB_0013a01a;
code_r0x00139c46:
  if (pmVar10 < pmVar3) goto LAB_0013a0e5;
  pmVar10->prev_foot = 0;
LAB_00139c56:
  bVar7 = true;
  if (pmVar13 == (malloc_tree_chunk *)0x0) goto LAB_00139cee;
  uVar9 = *(uint *)(((tbinptr)p)->child + 3);
  if ((tbinptr)p == m->treebins[uVar9]) {
    m->treebins[uVar9] = pmVar11;
    if (pmVar11 == (malloc_tree_chunk *)0x0) {
      bVar6 = (byte)uVar9 & 0x1f;
      m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      goto LAB_00139ca3;
    }
  }
  else {
    if (pmVar13 < (malloc_tree_chunk *)m->least_addr) goto LAB_0013a0e5;
    if (pmVar13->child[0] == (malloc_tree_chunk *)p) {
      pmVar13->child[0] = pmVar11;
    }
    else {
      pmVar13->child[1] = pmVar11;
    }
LAB_00139ca3:
    if (pmVar11 == (malloc_tree_chunk *)0x0) goto LAB_00139cee;
  }
  pmVar5 = (malloc_tree_chunk *)m->least_addr;
  if (pmVar11 < pmVar5) goto LAB_0013a0e5;
  pmVar11->child[2] = pmVar13;
  pmVar13 = ((tbinptr)p)->child[0];
  if (pmVar13 != (malloc_tree_chunk *)0x0) {
    if (pmVar13 < pmVar5) goto LAB_0013a0e5;
    pmVar11->child[0] = pmVar13;
    pmVar13->child[2] = pmVar11;
  }
  pmVar13 = ((tbinptr)p)->child[1];
  if (pmVar13 != (malloc_tree_chunk *)0x0) {
    if (pmVar13 < (malloc_tree_chunk *)m->least_addr) goto LAB_0013a0e5;
    pmVar11->child[1] = pmVar13;
    pmVar13->parent = pmVar11;
  }
LAB_00139cee:
  if (!bVar7) {
    return;
  }
LAB_00139cf7:
  pmVar3 = (tbinptr)m->least_addr;
  if (pmVar1 < pmVar3) goto LAB_0013a0e5;
  uVar15 = pmVar1->head;
  if ((uVar15 & 2) == 0) {
    if (pmVar1 == (tbinptr)m->top) {
      uVar15 = psize + m->topsize;
      m->topsize = uVar15;
      m->top = p;
      ((tbinptr)p)->head = uVar15 | 1;
      if ((tbinptr)p != (tbinptr)m->dv) {
        return;
      }
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
      return;
    }
    if (pmVar1 == (tbinptr)m->dv) {
      uVar15 = psize + m->dvsize;
      m->dvsize = uVar15;
      m->dv = p;
      ((tbinptr)p)->head = uVar15 | 1;
      *(ulong *)((long)((tbinptr)p)->child + (uVar15 - 0x20)) = uVar15;
      return;
    }
    if (uVar15 < 0x100) {
      pmVar10 = pmVar1->fd;
      pmVar4 = pmVar1->bk;
      if ((pmVar10 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
         ((pmVar10 < pmVar3 || (pmVar10->bk != pmVar1)))) goto LAB_0013a0e5;
      if (pmVar4 == pmVar10) {
        bVar6 = (byte)(uVar15 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      else {
        if ((pmVar4 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
           ((pmVar4 < pmVar3 || (pmVar4->fd != pmVar1)))) goto LAB_0013a0e5;
        pmVar10->bk = pmVar4;
        pmVar4->fd = pmVar10;
      }
    }
    else {
      pmVar11 = pmVar1->bk;
      pmVar13 = pmVar1->child[2];
      if (pmVar11 == pmVar1) {
        pmVar11 = pmVar1->child[1];
        if (pmVar11 != (malloc_tree_chunk *)0x0) {
          pmVar10 = (tbinptr)(pmVar1->child + 1);
LAB_00139ff6:
          do {
            if (pmVar11->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar11->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x0013a00a;
              pmVar10 = (tbinptr)pmVar11->child;
            }
            else {
              pmVar10 = (tbinptr)(pmVar11->child + 1);
            }
            pmVar11 = (malloc_tree_chunk *)pmVar10->prev_foot;
          } while( true );
        }
        pmVar11 = pmVar1->child[0];
        if (pmVar11 != (malloc_tree_chunk *)0x0) {
          pmVar10 = (tbinptr)pmVar1->child;
          goto LAB_00139ff6;
        }
        pmVar11 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar10 = pmVar1->fd;
        if (((pmVar10 < pmVar3) || (pmVar10->bk != pmVar1)) || (pmVar11->fd != pmVar1))
        goto LAB_0013a0e5;
        pmVar10->bk = pmVar11;
        pmVar11->fd = pmVar10;
      }
LAB_0013a01a:
      if (pmVar13 != (malloc_tree_chunk *)0x0) {
        uVar9 = *(uint *)(pmVar1->child + 3);
        if (pmVar1 == m->treebins[uVar9]) {
          m->treebins[uVar9] = pmVar11;
          if (pmVar11 == (malloc_tree_chunk *)0x0) {
            bVar6 = (byte)uVar9 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
            goto LAB_0013a066;
          }
        }
        else {
          if (pmVar13 < (malloc_tree_chunk *)m->least_addr) goto LAB_0013a0e5;
          if (pmVar13->child[0] == pmVar1) {
            pmVar13->child[0] = pmVar11;
          }
          else {
            pmVar13->child[1] = pmVar11;
          }
LAB_0013a066:
          if (pmVar11 == (malloc_tree_chunk *)0x0) goto LAB_0013a0a7;
        }
        pmVar5 = (malloc_tree_chunk *)m->least_addr;
        if (pmVar11 < pmVar5) goto LAB_0013a0e5;
        pmVar11->child[2] = pmVar13;
        pmVar13 = pmVar1->child[0];
        if (pmVar13 != (malloc_tree_chunk *)0x0) {
          if (pmVar13 < pmVar5) goto LAB_0013a0e5;
          pmVar11->child[0] = pmVar13;
          pmVar13->child[2] = pmVar11;
        }
        pmVar13 = pmVar1->child[1];
        if (pmVar13 != (malloc_tree_chunk *)0x0) {
          if (pmVar13 < (malloc_tree_chunk *)m->least_addr) goto LAB_0013a0e5;
          pmVar11->child[1] = pmVar13;
          pmVar13->parent = pmVar11;
        }
      }
    }
LAB_0013a0a7:
    psize = psize + (uVar15 & 0xfffffffffffffff8);
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
    if ((tbinptr)p == (tbinptr)m->dv) {
      m->dvsize = psize;
      return;
    }
  }
  else {
    pmVar1->head = uVar15 & 0xfffffffffffffffe;
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
  }
  if (psize < 0x100) {
    pmVar11 = (malloc_tree_chunk *)(m->smallbins + (psize >> 3) * 2);
    uVar9 = (uint)(psize >> 3);
    if ((m->smallmap >> (uVar9 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << (uVar9 & 0x1f);
      pmVar13 = pmVar11;
    }
    else {
      pmVar13 = pmVar11->fd;
      if (pmVar11->fd < (malloc_tree_chunk *)m->least_addr) {
LAB_0013a0e5:
        abort();
      }
    }
    pmVar11->fd = (malloc_tree_chunk *)p;
    pmVar13->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = pmVar13;
    ((tbinptr)p)->bk = pmVar11;
  }
  else {
    uVar9 = (uint)(psize >> 8);
    if (uVar9 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar9 < 0x10000) {
        uVar12 = ((uint)(psize >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar9)) & 0x3f)) & 1) +
                 LZCOUNT(uVar9) * 2 ^ 0x3e;
      }
    }
    pmVar11 = (malloc_tree_chunk *)(m->treebins + uVar12);
    *(uint *)(((tbinptr)p)->child + 3) = uVar12;
    ((tbinptr)p)->child[0] = (malloc_tree_chunk *)0x0;
    ((tbinptr)p)->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> (uVar12 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << (uVar12 & 0x1f);
      pmVar11->prev_foot = (size_t)p;
      ((tbinptr)p)->child[2] = pmVar11;
      ((tbinptr)p)->bk = (malloc_tree_chunk *)p;
      ((tbinptr)p)->fd = (malloc_tree_chunk *)p;
    }
    else {
      pmVar11 = (malloc_tree_chunk *)pmVar11->prev_foot;
      uVar15 = (ulong)(byte)(0x39 - (char)(uVar12 >> 1));
      if (uVar12 == 0x1f) {
        uVar15 = 0;
      }
      lVar14 = psize << (uVar15 & 0x3f);
      do {
        if ((pmVar11->head & 0xfffffffffffffff8) == psize) {
          if (((malloc_tree_chunk *)m->least_addr <= pmVar11) &&
             (pmVar13 = pmVar11->fd, (malloc_tree_chunk *)m->least_addr <= pmVar13)) {
            pmVar13->bk = (malloc_tree_chunk *)p;
            pmVar11->fd = (malloc_tree_chunk *)p;
            ((tbinptr)p)->fd = pmVar13;
            ((tbinptr)p)->bk = pmVar11;
            ((tbinptr)p)->child[2] = (malloc_tree_chunk *)0x0;
            return;
          }
          goto LAB_0013a0e5;
        }
        pmVar13 = *(malloc_tree_chunk **)((long)pmVar11 + (lVar14 >> 0x3f) * -8 + 0x20);
        pmVar5 = pmVar13;
        if (pmVar13 == (malloc_tree_chunk *)0x0) {
          puVar2 = (ulong *)((long)pmVar11 + (lVar14 >> 0x3f) * -8 + 0x20);
          if (puVar2 < m->least_addr) goto LAB_0013a0e5;
          *puVar2 = (ulong)p;
          ((tbinptr)p)->child[2] = pmVar11;
          ((tbinptr)p)->bk = (malloc_tree_chunk *)p;
          ((tbinptr)p)->fd = (malloc_tree_chunk *)p;
          pmVar5 = pmVar11;
        }
        pmVar11 = pmVar5;
        lVar14 = lVar14 * 2;
      } while (pmVar13 != (malloc_tree_chunk *)0x0);
    }
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}